

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

w_status wp_token_add_error(w_tokenizer *tokenizer,char *msg,...)

{
  char in_AL;
  w_status wVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_add_error",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x83);
  }
  if (msg == (char *)0x0) {
    w_handle_failed_assertion
              ("msg != NULL","wp_token_add_error",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x84);
  }
  local_e8.reg_save_area = local_c8;
  local_e8.overflow_arg_area = &args[0].overflow_arg_area;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  wVar1 = w_format_msg_va(tokenizer->errors[tokenizer->error_count].msg,0x80,msg,&local_e8);
  if (wVar1 == W_SUCCESS) {
    tokenizer->error_count = tokenizer->error_count + 1;
  }
  else {
    wp_log(W_LOG_LVL_ERROR,
           "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
           ,0x91,"failed to format the token error message\n");
  }
  return wVar1;
}

Assistant:

static enum w_status
wp_token_add_error(
    struct w_tokenizer *tokenizer,
    const char *msg,
    ...
)
{
    enum w_status status;
    va_list args;

    W_ASSERT(tokenizer != NULL);
    W_ASSERT(msg != NULL);

    va_start(args, msg);
    status = w_format_msg_va(
        tokenizer->errors[tokenizer->error_count].msg,
        W_GET_ARRAY_LEN(tokenizer->errors[tokenizer->error_count].msg),
        msg,
        args
    );
    va_end(args);

    if (status != W_SUCCESS)
    {
        W_LOG_ERROR("failed to format the token error message\n");
        return status;
    }

    ++tokenizer->error_count;

    W_ASSERT(status == W_SUCCESS);
    return status;
}